

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::CloseButton(ImGuiID id,ImVec2 *pos,float radius)

{
  ImGuiWindow *pIVar1;
  ImDrawList *pIVar2;
  bool bVar3;
  ImU32 IVar4;
  uint uVar5;
  uint idx;
  float fVar6;
  bool held;
  bool hovered;
  ImVec2 center;
  ImVec2 local_68;
  ImVec2 local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ImRect bb;
  
  pIVar1 = GImGui->CurrentWindow;
  pIVar1->Accessed = true;
  local_58 = (*pos).x;
  fStack_54 = (*pos).y;
  local_48 = local_58 - radius;
  fStack_44 = fStack_54 - radius;
  fStack_40 = 0.0 - radius;
  fStack_3c = 0.0 - radius;
  local_58 = radius + local_58;
  fStack_54 = radius + fStack_54;
  fStack_50 = radius + 0.0;
  fStack_4c = radius + 0.0;
  bb.Min.x = local_48;
  bb.Min.y = fStack_44;
  bb.Max.x = local_58;
  bb.Max.y = fStack_54;
  bVar3 = ButtonBehavior(&bb,id,&hovered,&held,0);
  uVar5 = (held ^ 1U) & hovered | 0x22;
  idx = 0x24;
  if ((hovered & 1U) == 0) {
    idx = uVar5;
  }
  if (held == false) {
    idx = uVar5;
  }
  IVar4 = GetColorU32(idx,1.0);
  center.y = (fStack_54 + fStack_44) * 0.5;
  center.x = (local_58 + local_48) * 0.5;
  fVar6 = 2.0;
  if (2.0 <= radius) {
    fVar6 = radius;
  }
  ImDrawList::AddCircleFilled(pIVar1->DrawList,&center,fVar6,IVar4,0xc);
  if (hovered == true) {
    fVar6 = radius * 0.7071 + -1.0;
    pIVar2 = pIVar1->DrawList;
    local_60.y = fVar6 + center.y;
    local_60.x = fVar6 + center.x;
    local_68.y = center.y - fVar6;
    local_68.x = center.x - fVar6;
    IVar4 = GetColorU32(0,1.0);
    ImDrawList::AddLine(pIVar2,&local_60,&local_68,IVar4,1.0);
    pIVar2 = pIVar1->DrawList;
    local_60.y = center.y - fVar6;
    local_60.x = fVar6 + center.x;
    local_68.y = fVar6 + center.y;
    local_68.x = center.x - fVar6;
    IVar4 = GetColorU32(0,1.0);
    ImDrawList::AddLine(pIVar2,&local_60,&local_68,IVar4,1.0);
  }
  return bVar3;
}

Assistant:

bool ImGui::CloseButton(ImGuiID id, const ImVec2& pos, float radius)
{
    ImGuiWindow* window = GetCurrentWindow();

    const ImRect bb(pos - ImVec2(radius,radius), pos + ImVec2(radius,radius));

    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held);

    // Render
    const ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_CloseButtonActive : hovered ? ImGuiCol_CloseButtonHovered : ImGuiCol_CloseButton);
    const ImVec2 center = bb.GetCenter();
    window->DrawList->AddCircleFilled(center, ImMax(2.0f, radius), col, 12);

    const float cross_extent = (radius * 0.7071f) - 1.0f;
    if (hovered)
    {
        window->DrawList->AddLine(center + ImVec2(+cross_extent,+cross_extent), center + ImVec2(-cross_extent,-cross_extent), GetColorU32(ImGuiCol_Text));
        window->DrawList->AddLine(center + ImVec2(+cross_extent,-cross_extent), center + ImVec2(-cross_extent,+cross_extent), GetColorU32(ImGuiCol_Text));
    }

    return pressed;
}